

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.c
# Opt level: O0

void native_to_little_endian(void *data,char *format)

{
  undefined2 uVar1;
  undefined4 uVar2;
  ushort **ppuVar3;
  undefined1 *puVar4;
  char *in_RSI;
  undefined4 *in_RDI;
  int32_t temp;
  uchar *cp;
  undefined4 *local_18;
  char *local_10;
  
  local_18 = in_RDI;
  for (local_10 = in_RSI; *local_10 != '\0'; local_10 = local_10 + 1) {
    if (*local_10 == 'L') {
      uVar2 = *local_18;
      *(char *)local_18 = (char)uVar2;
      *(char *)((long)local_18 + 1) = (char)((uint)uVar2 >> 8);
      puVar4 = (undefined1 *)((long)local_18 + 3);
      *(char *)((long)local_18 + 2) = (char)((uint)uVar2 >> 0x10);
      local_18 = local_18 + 1;
      *puVar4 = (char)((uint)uVar2 >> 0x18);
    }
    else if (*local_10 == 'S') {
      uVar1 = *(undefined2 *)local_18;
      puVar4 = (undefined1 *)((long)local_18 + 1);
      *(char *)local_18 = (char)uVar1;
      local_18 = (undefined4 *)((long)local_18 + 2);
      *puVar4 = (char)((ushort)uVar1 >> 8);
    }
    else {
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[(int)*local_10] & 0x800) != 0) {
        local_18 = (undefined4 *)((long)local_18 + (long)(*local_10 + -0x30));
      }
    }
  }
  return;
}

Assistant:

void native_to_little_endian (void *data, char *format)
{
    uchar *cp = (uchar *) data;
    int32_t temp;

    while (*format) {
        switch (*format) {
            case 'L':
                temp = * (int32_t *) cp;
                *cp++ = (uchar) temp;
                *cp++ = (uchar) (temp >> 8);
                *cp++ = (uchar) (temp >> 16);
                *cp++ = (uchar) (temp >> 24);
                break;

            case 'S':
                temp = * (short *) cp;
                *cp++ = (uchar) temp;
                *cp++ = (uchar) (temp >> 8);
                break;

            default:
                if (isdigit (*format))
                    cp += *format - '0';

                break;
        }

        format++;
    }
}